

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<MakefileGenerator::Compiler>::
emplace<MakefileGenerator::Compiler_const&>
          (QMovableArrayOps<MakefileGenerator::Compiler> *this,qsizetype i,Compiler *args)

{
  Compiler **ppCVar1;
  Compiler *pCVar2;
  undefined4 uVar3;
  Data *pDVar4;
  Compiler *pCVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  undefined4 uVar9;
  uint uVar10;
  qsizetype *pqVar11;
  bool bVar12;
  
  pDVar4 = (this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
           super_QArrayDataPointer<MakefileGenerator::Compiler>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00186b76:
    pDVar6 = (args->variable_in).d.d;
    pcVar7 = (args->variable_in).d.ptr;
    qVar8 = (args->variable_in).d.size;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
      UNLOCK();
    }
    uVar3 = args->flags;
    uVar9 = args->type;
    bVar12 = (this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
             super_QArrayDataPointer<MakefileGenerator::Compiler>.size != 0;
    QArrayDataPointer<MakefileGenerator::Compiler>::detachAndGrow
              ((QArrayDataPointer<MakefileGenerator::Compiler> *)this,(uint)(i == 0 && bVar12),1,
               (Compiler **)0x0,(QArrayDataPointer<MakefileGenerator::Compiler> *)0x0);
    pCVar5 = (this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
             super_QArrayDataPointer<MakefileGenerator::Compiler>.ptr;
    if (i != 0 || !bVar12) {
      pCVar2 = pCVar5 + i;
      memmove(pCVar2 + 1,pCVar5 + i,
              ((this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
               super_QArrayDataPointer<MakefileGenerator::Compiler>.size - i) * 0x20);
      (pCVar2->variable_in).d.d = pDVar6;
      (pCVar2->variable_in).d.ptr = pcVar7;
      (pCVar2->variable_in).d.size = qVar8;
      pCVar2->flags = uVar3;
      pCVar2->type = uVar9;
      goto LAB_00186c2e;
    }
    pCVar5[-1].variable_in.d.d = pDVar6;
    pCVar5[-1].variable_in.d.ptr = pcVar7;
    pCVar5[-1].variable_in.d.size = qVar8;
    pCVar5[-1].flags = uVar3;
    pCVar5[-1].type = uVar9;
  }
  else {
    if (((this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
         super_QArrayDataPointer<MakefileGenerator::Compiler>.size == i) &&
       (pCVar5 = (this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
                 super_QArrayDataPointer<MakefileGenerator::Compiler>.ptr,
       (pDVar4->super_QArrayData).alloc !=
       ((long)((long)pCVar5 -
              ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
       i)) {
      pDVar6 = (args->variable_in).d.d;
      pCVar5[i].variable_in.d.d = pDVar6;
      pCVar5[i].variable_in.d.ptr = (args->variable_in).d.ptr;
      pCVar5[i].variable_in.d.size = (args->variable_in).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      uVar10 = args->type;
      pCVar5[i].flags = args->flags;
      pCVar5[i].type = uVar10;
      goto LAB_00186c2e;
    }
    if ((i != 0) ||
       (pCVar5 = (this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
                 super_QArrayDataPointer<MakefileGenerator::Compiler>.ptr,
       (Compiler *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
       pCVar5)) goto LAB_00186b76;
    pDVar6 = (args->variable_in).d.d;
    pCVar5[-1].variable_in.d.d = pDVar6;
    pCVar5[-1].variable_in.d.ptr = (args->variable_in).d.ptr;
    pCVar5[-1].variable_in.d.size = (args->variable_in).d.size;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
      UNLOCK();
    }
    uVar10 = args->type;
    pCVar5[-1].flags = args->flags;
    pCVar5[-1].type = uVar10;
  }
  ppCVar1 = &(this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
             super_QArrayDataPointer<MakefileGenerator::Compiler>.ptr;
  *ppCVar1 = *ppCVar1 + -1;
LAB_00186c2e:
  pqVar11 = &(this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
             super_QArrayDataPointer<MakefileGenerator::Compiler>.size;
  *pqVar11 = *pqVar11 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }